

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::StencilTest::render(StencilTest *this,Context *ctx,Surface *dst)

{
  deUint32 dVar1;
  deUint32 program;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  Vector<float,_3> local_3c8;
  Vector<float,_3> local_3bc;
  Vector<float,_3> local_3b0;
  Vector<float,_3> local_3a4;
  Vector<float,_3> local_398;
  Vector<float,_3> local_38c;
  Vector<float,_4> local_380;
  Vector<float,_3> local_370;
  Vector<float,_3> local_364;
  Vector<float,_3> local_358;
  Vector<float,_3> local_34c;
  Vector<float,_4> local_340;
  undefined1 local_330 [8];
  Framebuffer fbo;
  bool depth;
  deUint32 metaballsTex;
  deUint32 quadsTex;
  int texHeight;
  int texWidth;
  int height;
  int width;
  deUint32 texShaderID;
  deUint32 colorShaderID;
  undefined1 local_2d0 [8];
  SingleTex2DShader texShader;
  FlatColorShader colorShader;
  Surface *dst_local;
  Context *ctx_local;
  StencilTest *this_local;
  
  FlatColorShader::FlatColorShader
            ((FlatColorShader *)&texShader.super_ShaderProgram.m_hasGeometryShader);
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_2d0);
  dVar1 = (*ctx->_vptr_Context[0x75])(ctx,&texShader.super_ShaderProgram.m_hasGeometryShader);
  program = (*ctx->_vptr_Context[0x75])(ctx,local_2d0);
  uVar3 = this->m_fboWidth;
  uVar4 = this->m_fboHeight;
  fbo.m_stencilbuffer = 2;
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  fbo.m_depthbuffer._3_1_ = pFVar5->depthbufferType != 0;
  createQuadsTex2D(ctx,1,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(ctx,fbo.m_stencilbuffer,0x1907,0x1401,0x40,0x40);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer((Framebuffer *)local_330,ctx,pFVar5,uVar3,uVar4,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_330);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_330);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar2);
  (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar3,(ulong)uVar4);
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[0x33])(ctx,0xb90);
  (*ctx->_vptr_Context[0x35])(ctx,0x207,0,0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e00,0x1e00,0x1e02);
  tcu::Vector<float,_4>::Vector(&local_340,0.0,0.0,1.0,1.0);
  FlatColorShader::setColor
            ((FlatColorShader *)&texShader.super_ShaderProgram.m_hasGeometryShader,ctx,dVar1,
             &local_340);
  tcu::Vector<float,_3>::Vector(&local_34c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_358,1.0,1.0,0.0);
  sglr::drawQuad(ctx,dVar1,&local_34c,&local_358);
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_2d0,ctx,program,0);
  tcu::Vector<float,_3>::Vector(&local_364,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_370,1.0,1.0,1.0);
  sglr::drawQuad(ctx,program,&local_364,&local_370);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  (*ctx->_vptr_Context[0x35])(ctx,0x202,(ulong)((fbo.m_depthbuffer._3_1_ & 1) + 1),0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e03,0x1e00);
  tcu::Vector<float,_4>::Vector(&local_380,0.0,1.0,0.0,1.0);
  FlatColorShader::setColor
            ((FlatColorShader *)&texShader.super_ShaderProgram.m_hasGeometryShader,ctx,dVar1,
             &local_380);
  tcu::Vector<float,_3>::Vector(&local_38c,-0.5,-0.5,0.0);
  tcu::Vector<float,_3>::Vector(&local_398,0.5,0.5,0.0);
  sglr::drawQuad(ctx,dVar1,&local_38c,&local_398);
  (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_stencilbuffer);
  (*ctx->_vptr_Context[0x35])(ctx,0x204,(ulong)(2 - (fbo.m_depthbuffer._3_1_ & 1)),0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e00,0x1e00);
  tcu::Vector<float,_3>::Vector(&local_3a4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_3b0,1.0,1.0,0.0);
  sglr::drawQuad(ctx,program,&local_3a4,&local_3b0);
  (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  pFVar5 = Functional::Framebuffer::getConfig((Framebuffer *)local_330);
  if (pFVar5->colorbufferType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[4])(ctx,0x84c0);
    dVar1 = Functional::Framebuffer::getColorbuffer((Framebuffer *)local_330);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)dVar1);
    uVar3 = (*ctx->_vptr_Context[2])();
    uVar4 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar3,(ulong)uVar4);
    tcu::Vector<float,_3>::Vector(&local_3bc,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_3c8,1.0,1.0,0.0);
    sglr::drawQuad(ctx,program,&local_3bc,&local_3c8);
    uVar3 = (*ctx->_vptr_Context[2])();
    uVar4 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  else {
    (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_330);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_2d0);
  FlatColorShader::~FlatColorShader
            ((FlatColorShader *)&texShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void StencilTest::render (sglr::Context& ctx, Surface& dst)
{
	FlatColorShader		colorShader;
	SingleTex2DShader	texShader;
	deUint32			colorShaderID	= ctx.createProgram(&colorShader);
	deUint32			texShaderID		= ctx.createProgram(&texShader);
	int					width			= m_fboWidth;
	int					height			= m_fboHeight;
	int					texWidth		= 64;
	int					texHeight		= 64;
	deUint32			quadsTex		= 1;
	deUint32			metaballsTex	= 2;
	bool				depth			= getConfig().depthbufferType != GL_NONE;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);

	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Bind framebuffer and clear
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render intersecting quads - increment stencil on depth pass
	ctx.enable(GL_DEPTH_TEST);
	ctx.enable(GL_STENCIL_TEST);
	ctx.stencilFunc(GL_ALWAYS, 0, 0xffu);
	ctx.stencilOp(GL_KEEP, GL_KEEP, GL_INCR);

	colorShader.setColor(ctx, colorShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
	sglr::drawQuad(ctx, colorShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	texShader.setUnit(ctx, texShaderID, 0);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(+1.0f, +1.0f, +1.0f));

	// Draw quad with stencil test (stencil == 1 or 2 depending on depth) - decrement on stencil failure
	ctx.disable(GL_DEPTH_TEST);
	ctx.stencilFunc(GL_EQUAL, depth ? 2 : 1, 0xffu);
	ctx.stencilOp(GL_DECR, GL_KEEP, GL_KEEP);
	colorShader.setColor(ctx, colorShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	sglr::drawQuad(ctx, colorShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(+0.5f, +0.5f, 0.0f));

	// Draw metaballs with stencil test where stencil > 1 or 2 depending on depth buffer
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	ctx.stencilFunc(GL_GREATER, depth ? 1 : 2, 0xffu);
	ctx.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	ctx.disable(GL_STENCIL_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);
		ctx.activeTexture(GL_TEXTURE0);
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
		ctx.readPixels(dst, 0, 0, width, height);
}